

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::ProcessBlockAvailability
          (PeerManagerImpl *this,NodeId nodeid)

{
  long lVar1;
  bool bVar2;
  CNodeState *pCVar3;
  CBlockIndex *pCVar4;
  uint256 *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *pindex;
  CNodeState *state;
  arith_uint256 *in_stack_ffffffffffffffa0;
  uint7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 uVar5;
  BlockManager *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = State((PeerManagerImpl *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                 (NodeId)in_stack_ffffffffffffffa0);
  if (pCVar3 == (CNodeState *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x5bf,
                  "void (anonymous namespace)::PeerManagerImpl::ProcessBlockAvailability(NodeId)");
  }
  bVar2 = base_blob<256U>::IsNull
                    ((base_blob<256U> *)
                     CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  if (!bVar2) {
    pCVar4 = ::node::BlockManager::LookupBlockIndex(in_stack_ffffffffffffffb8,in_RDI);
    uVar5 = false;
    if (pCVar4 != (CBlockIndex *)0x0) {
      in_stack_ffffffffffffffa0 = &pCVar4->nChainWork;
      base_uint<256U>::base_uint
                ((base_uint<256U> *)(ulong)in_stack_ffffffffffffffa8,
                 (uint64_t)in_stack_ffffffffffffffa0);
      uVar5 = operator>((base_uint<256U> *)CONCAT17(uVar5,in_stack_ffffffffffffffa8),
                        &in_stack_ffffffffffffffa0->super_base_uint<256U>);
    }
    if ((bool)uVar5 != false) {
      if ((pCVar3->pindexBestKnownBlock == (CBlockIndex *)0x0) ||
         (bVar2 = operator>=((base_uint<256U> *)CONCAT17(uVar5,in_stack_ffffffffffffffa8),
                             &in_stack_ffffffffffffffa0->super_base_uint<256U>), bVar2)) {
        pCVar3->pindexBestKnownBlock = pCVar4;
      }
      base_blob<256U>::SetNull((base_blob<256U> *)in_stack_ffffffffffffffa0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessBlockAvailability(NodeId nodeid) {
    CNodeState *state = State(nodeid);
    assert(state != nullptr);

    if (!state->hashLastUnknownBlock.IsNull()) {
        const CBlockIndex* pindex = m_chainman.m_blockman.LookupBlockIndex(state->hashLastUnknownBlock);
        if (pindex && pindex->nChainWork > 0) {
            if (state->pindexBestKnownBlock == nullptr || pindex->nChainWork >= state->pindexBestKnownBlock->nChainWork) {
                state->pindexBestKnownBlock = pindex;
            }
            state->hashLastUnknownBlock.SetNull();
        }
    }
}